

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_fma.cpp
# Opt level: O0

void __thiscall
ncnn::DeformableConv2D_x86_fma::DeformableConv2D_x86_fma(DeformableConv2D_x86_fma *this)

{
  long *in_RDI;
  DeformableConv2D *in_stack_fffffffffffffff8;
  
  DeformableConv2D::DeformableConv2D(in_stack_fffffffffffffff8);
  *in_RDI = (long)&PTR_create_pipeline_01d44870;
  in_RDI[0xc] = (long)&PTR__DeformableConv2D_x86_fma_01d448f0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  *(undefined4 *)(in_RDI + 5) = 0;
  in_RDI[6] = 0;
  *(undefined4 *)(in_RDI + 7) = 0;
  *(undefined4 *)((long)in_RDI + 0x3c) = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)((long)in_RDI + 0x44) = 0;
  *(undefined4 *)(in_RDI + 9) = 0;
  in_RDI[10] = 0;
  *(undefined1 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb) = 1;
  in_RDI[1] = 0;
  in_RDI[0xb] = 0;
  return;
}

Assistant:

DeformableConv2D_x86_fma::DeformableConv2D_x86_fma()
{
#if __SSE2__
    support_packing = true;
#endif // __SSE2__

    activation = 0;
    gemm = 0;
}